

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O0

void __thiscall
Gudhi::Simplex_tree<MyOptions>::Simplex_tree
          (Simplex_tree<MyOptions> *this,Simplex_tree<MyOptions> *complex_source)

{
  Simplex_tree<MyOptions> *complex_source_local;
  Simplex_tree<MyOptions> *this_local;
  
  std::
  unordered_map<short,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>,_std::hash<short>,_std::equal_to<short>,_std::allocator<std::pair<const_short,_boost::intrusive::list<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::member_hook<Gudhi::Hooks_simplex_base_link_nodes,_boost::intrusive::list_member_hook<boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>_>,_&Gudhi::Hooks_simplex_base_link_nodes::list_max_vertex_hook_>,_boost::intrusive::constant_time_size<false>_>_>_>_>
  ::unordered_map(&this->nodes_label_to_list_);
  Simplex_tree_siblings<Gudhi::Simplex_tree<MyOptions>,_boost::container::flat_map<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>,_std::less<short>,_void>_>
  ::Simplex_tree_siblings(&this->root_);
  std::
  vector<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_true>,_std::allocator<boost::container::vec_iterator<std::pair<short,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<MyOptions>_>_>_*,_true>_>_>
  ::vector(&this->filtration_vect_);
  this->dimension_to_be_lowered_ = false;
  copy_from(this,complex_source);
  return;
}

Assistant:

Simplex_tree(const Simplex_tree& complex_source) {
#ifdef DEBUG_TRACES
    std::clog << "Simplex_tree copy constructor" << std::endl;
#endif  // DEBUG_TRACES
    copy_from(complex_source);
  }